

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O3

int Abc_NodeBalanceConeExor_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vSuper,int fFirst)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  void **ppvVar5;
  ulong uVar6;
  size_t __size;
  
  uVar4 = vSuper->nSize;
  if (0 < (int)uVar4) {
    uVar6 = 0;
    do {
      if ((Abc_Obj_t *)vSuper->pArray[uVar6] == pNode) {
        return 1;
      }
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if ((fFirst == 0) && ((*(uint *)&pNode->field_0x14 & 0x10f) != 0x107)) {
    if (uVar4 == vSuper->nCap) {
      if ((int)uVar4 < 0x10) {
        if (vSuper->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc(0x80);
        }
        else {
          ppvVar5 = (void **)realloc(vSuper->pArray,0x80);
        }
        vSuper->pArray = ppvVar5;
        vSuper->nCap = 0x10;
      }
      else {
        __size = (ulong)uVar4 << 4;
        if (vSuper->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc(__size);
        }
        else {
          ppvVar5 = (void **)realloc(vSuper->pArray,__size);
        }
        vSuper->pArray = ppvVar5;
        vSuper->nCap = uVar4 * 2;
      }
    }
    else {
      ppvVar5 = vSuper->pArray;
    }
    iVar2 = vSuper->nSize;
    vSuper->nSize = iVar2 + 1;
    ppvVar5[iVar2] = pNode;
    uVar4 = 0;
  }
  else {
    if (((ulong)pNode & 1) != 0) {
      __assert_fail("!Abc_ObjIsComplement(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcBalance.c"
                    ,0x195,"int Abc_NodeBalanceConeExor_rec(Abc_Obj_t *, Vec_Ptr_t *, int)");
    }
    if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
      __assert_fail("Abc_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcBalance.c"
                    ,0x196,"int Abc_NodeBalanceConeExor_rec(Abc_Obj_t *, Vec_Ptr_t *, int)");
    }
    if ((*(uint *)&pNode->field_0x14 >> 8 & 1) == 0) {
      __assert_fail("pNode->fExor",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcBalance.c"
                    ,0x197,"int Abc_NodeBalanceConeExor_rec(Abc_Obj_t *, Vec_Ptr_t *, int)");
    }
    plVar1 = (long *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray];
    iVar2 = Abc_NodeBalanceConeExor_rec
                      (*(Abc_Obj_t **)
                        (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8),
                       vSuper,0);
    plVar1 = (long *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray];
    iVar3 = Abc_NodeBalanceConeExor_rec
                      (*(Abc_Obj_t **)
                        (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                        (long)*(int *)(plVar1[4] + 4) * 8),vSuper,0);
    uVar4 = (uint)(iVar3 != 0 || iVar2 != 0);
  }
  return uVar4;
}

Assistant:

int Abc_NodeBalanceConeExor_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vSuper, int fFirst )
{
    int RetValue1, RetValue2, i;
    // check if the node occurs in the same polarity
    for ( i = 0; i < vSuper->nSize; i++ )
        if ( vSuper->pArray[i] == pNode )
            return 1;
    // if the new node is complemented or a PI, another gate begins
    if ( !fFirst && (!pNode->fExor || !Abc_ObjIsNode(pNode)) )
    {
        Vec_PtrPush( vSuper, pNode );
        return 0;
    }
    assert( !Abc_ObjIsComplement(pNode) );
    assert( Abc_ObjIsNode(pNode) );
    assert( pNode->fExor );
    // go through the branches
    RetValue1 = Abc_NodeBalanceConeExor_rec( Abc_ObjFanin0(Abc_ObjFanin0(pNode)), vSuper, 0 );
    RetValue2 = Abc_NodeBalanceConeExor_rec( Abc_ObjFanin1(Abc_ObjFanin0(pNode)), vSuper, 0 );
    if ( RetValue1 == -1 || RetValue2 == -1 )
        return -1;
    // return 1 if at least one branch has a duplicate
    return RetValue1 || RetValue2;
}